

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Validator.cpp
# Opt level: O0

void Validator::printEvaluation(Solution *solution)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  ostream *poVar8;
  void *pvVar9;
  uint sum;
  Solution *solution_local;
  
  poVar8 = std::operator<<((ostream *)&std::cout,"S1 : ");
  uVar1 = constraintS1(solution);
  pvVar9 = (void *)std::ostream::operator<<(poVar8,uVar1);
  std::ostream::operator<<(pvVar9,std::endl<char,std::char_traits<char>>);
  uVar1 = constraintS1(solution);
  poVar8 = std::operator<<((ostream *)&std::cout,"S2 : ");
  uVar2 = constraintS2(solution);
  pvVar9 = (void *)std::ostream::operator<<(poVar8,uVar2);
  std::ostream::operator<<(pvVar9,std::endl<char,std::char_traits<char>>);
  uVar2 = constraintS2(solution);
  poVar8 = std::operator<<((ostream *)&std::cout,"S3 : ");
  uVar3 = constraintS3(solution);
  pvVar9 = (void *)std::ostream::operator<<(poVar8,uVar3);
  std::ostream::operator<<(pvVar9,std::endl<char,std::char_traits<char>>);
  uVar3 = constraintS3(solution);
  poVar8 = std::operator<<((ostream *)&std::cout,"S4 : ");
  uVar4 = constraintS4(solution);
  pvVar9 = (void *)std::ostream::operator<<(poVar8,uVar4);
  std::ostream::operator<<(pvVar9,std::endl<char,std::char_traits<char>>);
  uVar4 = constraintS4(solution);
  poVar8 = std::operator<<((ostream *)&std::cout,"S5 : ");
  uVar5 = constraintS5(solution);
  pvVar9 = (void *)std::ostream::operator<<(poVar8,uVar5);
  std::ostream::operator<<(pvVar9,std::endl<char,std::char_traits<char>>);
  uVar5 = constraintS5(solution);
  poVar8 = std::operator<<((ostream *)&std::cout,"S6 : ");
  uVar6 = constraintS6(solution);
  pvVar9 = (void *)std::ostream::operator<<(poVar8,uVar6);
  std::ostream::operator<<(pvVar9,std::endl<char,std::char_traits<char>>);
  uVar6 = constraintS6(solution);
  poVar8 = std::operator<<((ostream *)&std::cout,"S7 : ");
  uVar7 = constraintS7(solution);
  pvVar9 = (void *)std::ostream::operator<<(poVar8,uVar7);
  std::ostream::operator<<(pvVar9,std::endl<char,std::char_traits<char>>);
  uVar7 = constraintS7(solution);
  poVar8 = std::operator<<((ostream *)&std::cout,"Sum : ");
  pvVar9 = (void *)std::ostream::operator<<
                             (poVar8,uVar7 + uVar6 + uVar5 + uVar4 + uVar3 + uVar2 + uVar1);
  std::ostream::operator<<(pvVar9,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void Validator::printEvaluation(const Solution &solution){
    unsigned int sum = 0;

    cout << "S1 : " << constraintS1(solution) << endl;
    sum += constraintS1(solution);
    cout << "S2 : " << constraintS2(solution) << endl;
    sum += constraintS2(solution);
    cout << "S3 : " << constraintS3(solution) << endl;
    sum += constraintS3(solution);
    cout << "S4 : " << constraintS4(solution) << endl;
    sum += constraintS4(solution);
    cout << "S5 : " << constraintS5(solution) << endl;
    sum += constraintS5(solution);
    cout << "S6 : " << constraintS6(solution) << endl;
    sum += constraintS6(solution);
    cout << "S7 : " << constraintS7(solution) << endl;
    sum += constraintS7(solution);


    cout << "Sum : " << sum << endl;
}